

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::reportError
          (DOMLSSerializerImpl *this,DOMNode *errorNode,ErrorSeverity errorType,Codes toEmit)

{
  byte bVar1;
  XMLMsgLoader *pXVar2;
  DOMLSException *this_00;
  undefined1 local_898 [8];
  DOMErrorImpl domError;
  DOMLocatorImpl locator;
  XMLCh local_828 [3];
  bool toContinueProcess;
  XMLCh errText [1024];
  XMLSize_t msgSize;
  Codes toEmit_local;
  ErrorSeverity errorType_local;
  DOMNode *errorNode_local;
  DOMLSSerializerImpl *this_local;
  
  errText[0x3fc] = L'Ͽ';
  errText[0x3fd] = L'\0';
  errText[0x3fe] = L'\0';
  errText[0x3ff] = L'\0';
  pXVar2 = DOMImplementationImpl::getMsgLoader4DOM();
  (*pXVar2->_vptr_XMLMsgLoader[2])(pXVar2,(ulong)toEmit,local_828,0x3ff);
  locator.fURI._7_1_ = true;
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    DOMLocatorImpl::DOMLocatorImpl
              ((DOMLocatorImpl *)&domError.fRelatedData,0,0,errorNode,(XMLCh *)0x0,
               0xffffffffffffffff,0xffffffffffffffff);
    DOMErrorImpl::DOMErrorImpl
              ((DOMErrorImpl *)local_898,errorType,local_828,(DOMLocator *)&domError.fRelatedData);
    bVar1 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,local_898);
    locator.fURI._7_1_ = (bool)(bVar1 & 1);
    DOMErrorImpl::~DOMErrorImpl((DOMErrorImpl *)local_898);
    DOMLocatorImpl::~DOMLocatorImpl((DOMLocatorImpl *)&domError.fRelatedData);
  }
  if (errorType != DOM_SEVERITY_WARNING) {
    this->fErrorCount = this->fErrorCount + 1;
  }
  if ((errorType != DOM_SEVERITY_FATAL_ERROR) && (locator.fURI._7_1_ != false)) {
    return locator.fURI._7_1_;
  }
  this_00 = (DOMLSException *)__cxa_allocate_exception(0x28);
  msgSize._0_2_ = (short)toEmit;
  DOMLSException::DOMLSException(this_00,0x52,(short)msgSize,this->fMemoryManager);
  __cxa_throw(this_00,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
}

Assistant:

bool DOMLSSerializerImpl::reportError(const DOMNode* const    errorNode
                              , DOMError::ErrorSeverity errorType
                              , XMLDOMMsg::Codes        toEmit)
{
    const XMLSize_t msgSize = 1023;
    XMLCh errText[msgSize + 1];

    DOMImplementationImpl::getMsgLoader4DOM()->loadMsg(toEmit, errText, msgSize);

    bool toContinueProcess = true;   // default value for no error handler

    if (fErrorHandler)
    {
        DOMLocatorImpl  locator(0, 0, (DOMNode*) errorNode, 0);
        DOMErrorImpl    domError(errorType , errText, &locator);
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
    }

    if (errorType != DOMError::DOM_SEVERITY_WARNING)
        fErrorCount++;

    if (errorType == DOMError::DOM_SEVERITY_FATAL_ERROR || !toContinueProcess)
        throw DOMLSException(DOMLSException::SERIALIZE_ERR, toEmit, fMemoryManager);

    return toContinueProcess;
}